

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_sunmatrix.c
# Opt level: O2

int Test_SUNMatClone(SUNMatrix A,int myid)

{
  int iVar1;
  SUNMatrix A_00;
  char *__s;
  
  A_00 = (SUNMatrix)SUNMatClone();
  sync_device(A);
  if (A_00 == (SUNMatrix)0x0) {
    if (print_all_ranks != 0 || myid != 0) {
      if (print_all_ranks == 0) {
        if (myid != 0) {
          return 1;
        }
        goto LAB_00104160;
      }
      printf("process %06d: ",myid);
    }
    puts(">>> FAILED test -- SUNMatClone ");
    if (print_all_ranks != 0 || myid != 0) {
      if (print_all_ranks != 0) {
        printf("process %06d: ",myid);
        puts("    After SUNMatClone, B == NULL \n ");
        return 1;
      }
      return 1;
    }
LAB_00104160:
    puts("    After SUNMatClone, B == NULL \n ");
    return 1;
  }
  iVar1 = has_data(A_00);
  if (iVar1 == 0) {
    if (print_all_ranks == 0 && myid == 0) {
LAB_001040ae:
      puts(">>> FAILED test -- SUNMatClone ");
      if (print_all_ranks != 0 || myid != 0) {
        if (print_all_ranks == 0) goto LAB_001041db;
        printf("process %06d: ",myid);
      }
    }
    else {
      if (print_all_ranks != 0) {
        printf("process %06d: ",myid);
        goto LAB_001040ae;
      }
      if (myid != 0) goto LAB_001041db;
    }
    __s = "    Matrix data == NULL \n ";
  }
  else {
    iVar1 = SUNMatCopy(A,A_00);
    if (iVar1 == 0) {
      iVar1 = check_matrix(A,A_00,2.220446049250313e-15);
      if (iVar1 == 0) {
        if (print_all_ranks != 0 || myid != 0) {
          if (print_all_ranks == 0) goto LAB_001041a1;
          printf("process %06d: ",myid);
        }
        puts("    PASSED test -- SUNMatClone ");
LAB_001041a1:
        if ((myid == 0) && (print_time != 0)) {
          printf("    SUNMatClone Time: %22.15e \n \n",0);
        }
        SUNMatDestroy(A_00);
        return 0;
      }
      if (print_all_ranks == 0 && myid == 0) {
LAB_00104122:
        puts(">>> FAILED test -- SUNMatClone ");
        if (print_all_ranks != 0 || myid != 0) {
          if (print_all_ranks == 0) goto LAB_001041db;
          printf("process %06d: ",myid);
        }
      }
      else {
        if (print_all_ranks != 0) {
          printf("process %06d: ",myid);
          goto LAB_00104122;
        }
        if (myid != 0) goto LAB_001041db;
      }
      __s = "    Failed SUNMatClone check \n ";
    }
    else {
      if (print_all_ranks != 0 || myid != 0) {
        if (print_all_ranks == 0) goto LAB_001041db;
        printf("process %06d: ",myid);
      }
      __s = ">>> FAILED test -- SUNMatClone (error using SUNMatCopy) ";
    }
  }
  puts(__s);
LAB_001041db:
  SUNMatDestroy(A_00);
  return 1;
}

Assistant:

int Test_SUNMatClone(SUNMatrix A, int myid)
{
  int failure;
  double start_time, stop_time;
  sunrealtype tol = 10 * SUN_UNIT_ROUNDOFF;
  SUNMatrix B;

  /* clone matrix */
  start_time = get_time();
  B          = SUNMatClone(A);
  sync_device(A);
  stop_time = get_time();

  /* check cloned matrix */
  if (B == NULL)
  {
    TEST_STATUS(">>> FAILED test -- SUNMatClone \n", myid);
    TEST_STATUS("    After SUNMatClone, B == NULL \n \n", myid);
    return (1);
  }

  /* check cloned matrix data */
  if (!has_data(B))
  {
    TEST_STATUS(">>> FAILED test -- SUNMatClone \n", myid);
    TEST_STATUS("    Matrix data == NULL \n \n", myid);
    SUNMatDestroy(B);
    return (1);
  }

  failure = SUNMatCopy(A, B);
  if (failure)
  {
    TEST_STATUS(">>> FAILED test -- SUNMatClone (error using SUNMatCopy) \n",
                myid);
    SUNMatDestroy(B);
    return (1);
  }

  failure = check_matrix(A, B, tol);
  if (failure)
  {
    TEST_STATUS(">>> FAILED test -- SUNMatClone \n", myid);
    TEST_STATUS("    Failed SUNMatClone check \n \n", myid);
    SUNMatDestroy(B);
    return (1);
  }
  else { TEST_STATUS("    PASSED test -- SUNMatClone \n", myid); }

  if (myid == 0)
  {
    PRINT_TIME("    SUNMatClone Time: %22.15e \n \n", stop_time - start_time);
  }

  SUNMatDestroy(B);
  return (0);
}